

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AstCompiler.cpp
# Opt level: O0

void __thiscall
compiler::CompilerAstWalker::onExitFunctionDeclarationExpressionAstNode
          (CompilerAstWalker *this,FunctionDeclarationExpressionAstNode *node)

{
  bool bVar1;
  element_type *peVar2;
  size_type argumentCount;
  size_type localsCount;
  vector<bytecode::ByteCode,_std::allocator<bytecode::ByteCode>_> local_c8;
  vector<bytecode::ClosureContext,_std::allocator<bytecode::ClosureContext>_> local_b0;
  Function local_98;
  reference local_58;
  ClosureContext *cc;
  iterator __end2;
  iterator __begin2;
  vector<compiler::ClosureContext,_std::allocator<compiler::ClosureContext>_> *__range2;
  vector<bytecode::ClosureContext,_std::allocator<bytecode::ClosureContext>_> closures;
  size_t fnIndex;
  FunctionDeclarationExpressionAstNode *node_local;
  CompilerAstWalker *this_local;
  
  emit(this,LoadUndefinedConstant);
  emit(this,Return);
  closures.super__Vector_base<bytecode::ClosureContext,_std::allocator<bytecode::ClosureContext>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage =
       (pointer)std::vector<bytecode::Function,_std::allocator<bytecode::Function>_>::size
                          (&this->functions);
  std::vector<bytecode::ClosureContext,_std::allocator<bytecode::ClosureContext>_>::vector
            ((vector<bytecode::ClosureContext,_std::allocator<bytecode::ClosureContext>_> *)
             &__range2);
  peVar2 = std::
           __shared_ptr_access<compiler::EmissionContext,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<compiler::EmissionContext,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&this->ec);
  __end2 = std::vector<compiler::ClosureContext,_std::allocator<compiler::ClosureContext>_>::begin
                     (&peVar2->closures);
  cc = (ClosureContext *)
       std::vector<compiler::ClosureContext,_std::allocator<compiler::ClosureContext>_>::end
                 (&peVar2->closures);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end2,(__normal_iterator<compiler::ClosureContext_*,_std::vector<compiler::ClosureContext,_std::allocator<compiler::ClosureContext>_>_>
                                *)&cc);
    if (!bVar1) break;
    local_58 = __gnu_cxx::
               __normal_iterator<compiler::ClosureContext_*,_std::vector<compiler::ClosureContext,_std::allocator<compiler::ClosureContext>_>_>
               ::operator*(&__end2);
    std::vector<bytecode::ClosureContext,std::allocator<bytecode::ClosureContext>>::
    emplace_back<unsigned_long_const&,unsigned_long_const&>
              ((vector<bytecode::ClosureContext,std::allocator<bytecode::ClosureContext>> *)
               &__range2,&local_58->outerScopeCount,&local_58->localScopeIndex);
    __gnu_cxx::
    __normal_iterator<compiler::ClosureContext_*,_std::vector<compiler::ClosureContext,_std::allocator<compiler::ClosureContext>_>_>
    ::operator++(&__end2);
  }
  argumentCount =
       std::vector<std::shared_ptr<Token>,_std::allocator<std::shared_ptr<Token>_>_>::size
                 (&node->parameters);
  peVar2 = std::
           __shared_ptr_access<compiler::EmissionContext,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<compiler::EmissionContext,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&this->ec);
  localsCount = std::
                vector<compiler::VariableDeclaration,_std::allocator<compiler::VariableDeclaration>_>
                ::size(&peVar2->variables);
  std::vector<bytecode::ClosureContext,_std::allocator<bytecode::ClosureContext>_>::vector
            (&local_b0,
             (vector<bytecode::ClosureContext,_std::allocator<bytecode::ClosureContext>_> *)
             &__range2);
  peVar2 = std::
           __shared_ptr_access<compiler::EmissionContext,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<compiler::EmissionContext,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&this->ec);
  std::vector<bytecode::ByteCode,_std::allocator<bytecode::ByteCode>_>::vector
            (&local_c8,&peVar2->byteCode);
  bytecode::Function::Function(&local_98,argumentCount,localsCount,&local_b0,&local_c8);
  std::vector<bytecode::Function,_std::allocator<bytecode::Function>_>::
  emplace_back<bytecode::Function>(&this->functions,&local_98);
  bytecode::Function::~Function(&local_98);
  std::vector<bytecode::ByteCode,_std::allocator<bytecode::ByteCode>_>::~vector(&local_c8);
  std::vector<bytecode::ClosureContext,_std::allocator<bytecode::ClosureContext>_>::~vector
            (&local_b0);
  popEmissionContext(this);
  emit(this,MakeFn,
       (size_t)closures.
               super__Vector_base<bytecode::ClosureContext,_std::allocator<bytecode::ClosureContext>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::vector<bytecode::ClosureContext,_std::allocator<bytecode::ClosureContext>_>::~vector
            ((vector<bytecode::ClosureContext,_std::allocator<bytecode::ClosureContext>_> *)
             &__range2);
  return;
}

Assistant:

void onExitFunctionDeclarationExpressionAstNode(FunctionDeclarationExpressionAstNode* node) noexcept override {

    this->emit(bytecode::ByteCodeInstruction::LoadUndefinedConstant);
    this->emit(bytecode::ByteCodeInstruction::Return);

    std::size_t fnIndex = this->functions.size();

    std::vector<bytecode::ClosureContext> closures;

    for (const auto& cc : this->ec->closures) {
      closures.emplace_back(cc.outerScopeCount, cc.localScopeIndex);
    }

    this->functions.emplace_back(bytecode::Function{
      node->parameters.size(),
      this->ec->variables.size(),
      closures,
      this->ec->byteCode
    });

    this->popEmissionContext();

    this->emit(bytecode::ByteCodeInstruction::MakeFn, fnIndex);
  }